

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t RegNo;
  uint uVar6;
  DecodeStatus DVar7;
  uint Rd;
  uint Rm;
  uint Rn;
  uint wb;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rn = 3;
  _wb = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  uVar4 = uVar2 | uVar3 << 4;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,4,2);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar6 = MCInst_getOpcode(pMStack_18);
  if (0xb < uVar6 - 0x391) {
    if (uVar6 - 0x3d2 < 9) {
      DVar7 = DecodeDPairSpacedRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_wb);
      _Var1 = Check(&Rn,DVar7);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_0016e6d6;
    }
    if (8 < uVar6 - 0x3db) {
      DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_wb);
      _Var1 = Check(&Rn,DVar7);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_0016e6d6;
    }
  }
  DVar7 = DecodeDPairRegisterClass(pMStack_18,uVar4,(uint64_t)Decoder_local,_wb);
  _Var1 = Check(&Rn,DVar7);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
LAB_0016e6d6:
  uVar6 = MCInst_getOpcode(pMStack_18);
  switch(uVar6) {
  case 0x43d:
  case 0x440:
  case 0x441:
  case 0x444:
  case 0x445:
  case 0x448:
  case 0x4b1:
  case 0x4b4:
  case 0x4b5:
  case 0x4b8:
  case 0x4b9:
  case 0x4bc:
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 1 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  case 0x452:
  case 0x454:
  case 0x457:
  case 0x459:
  case 0x45c:
  case 0x45e:
  case 0x4c6:
  case 0x4c8:
  case 0x4cb:
  case 0x4cd:
  case 0x4d0:
  case 0x4d2:
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 2 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  default:
  }
  uVar6 = MCInst_getOpcode(pMStack_18);
  switch(uVar6) {
  case 0x43d:
  case 0x440:
  case 0x441:
  case 0x444:
  case 0x445:
  case 0x448:
  case 0x4b1:
  case 0x4b4:
  case 0x4b5:
  case 0x4b8:
  case 0x4b9:
  case 0x4bc:
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 2 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case 0x452:
  case 0x454:
  case 0x457:
  case 0x459:
  case 0x45c:
  case 0x45e:
  case 0x4c6:
  case 0x4c8:
  case 0x4cb:
  case 0x4cd:
  case 0x4d0:
  case 0x4d2:
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 4 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar6 = MCInst_getOpcode(pMStack_18);
  if ((((uVar6 == 0x4b1) || (uVar6 - 0x4b4 < 2)) || (uVar6 - 0x4b8 < 2)) || (uVar6 == 0x4bc)) {
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 3 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else if ((((uVar6 == 0x4c6) || (uVar6 == 0x4c8)) ||
           ((uVar6 == 0x4cb || ((uVar6 == 0x4cd || (uVar6 == 0x4d0)))))) || (uVar6 == 0x4d2)) {
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar4 + 6 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar4 = MCInst_getOpcode(pMStack_18);
  switch(uVar4) {
  case 0x369:
  case 0x36a:
  case 0x36c:
  case 0x36d:
  case 0x36e:
  case 0x36f:
  case 0x372:
  case 0x373:
  case 0x375:
  case 0x376:
  case 0x377:
  case 0x378:
  case 0x37e:
  case 0x37f:
  case 900:
  case 0x385:
  case 0x386:
  case 0x387:
  case 0x38a:
  case 0x38b:
  case 0x38d:
  case 0x38e:
  case 0x38f:
  case 0x390:
  case 0x392:
  case 0x393:
  case 0x395:
  case 0x396:
  case 0x398:
  case 0x399:
  case 0x39b:
  case 0x39c:
  case 0x3d3:
  case 0x3d4:
  case 0x3d6:
  case 0x3d7:
  case 0x3d9:
  case 0x3da:
  case 0x3dc:
  case 0x3dd:
  case 0x3df:
  case 0x3e0:
  case 0x3e2:
  case 0x3e3:
  case 1000:
  case 0x3e9:
  case 0x3ee:
  case 0x3ef:
  case 0x3f4:
  case 0x3f5:
    MCOperand_CreateImm0(pMStack_18,0);
    break;
  default:
    break;
  case 0x440:
  case 0x444:
  case 0x448:
  case 0x454:
  case 0x459:
  case 0x45e:
  case 0x4b4:
  case 0x4b8:
  case 0x4bc:
  case 0x4c8:
  case 0x4cd:
  case 0x4d2:
    DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar7 = DecodeAddrMode6Operand(pMStack_18,uVar3 | uVar5 << 4,(uint64_t)Decoder_local,_wb);
  _Var1 = Check(&Rn,DVar7);
  if (_Var1) {
    uVar4 = MCInst_getOpcode(pMStack_18);
    switch(uVar4) {
    default:
      if (RegNo == 0xd) {
        MCOperand_CreateReg0(pMStack_18,0);
        return Rn;
      }
    case 0x369:
    case 0x36c:
    case 0x36e:
    case 0x36f:
    case 0x372:
    case 0x375:
    case 0x377:
    case 0x378:
    case 0x37e:
    case 900:
    case 0x386:
    case 0x387:
    case 0x38a:
    case 0x38d:
    case 0x38f:
    case 0x390:
    case 0x392:
    case 0x393:
    case 0x395:
    case 0x396:
    case 0x398:
    case 0x399:
    case 0x39b:
    case 0x39c:
      if ((RegNo != 0xd) && (RegNo != 0xf)) {
        DVar7 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_wb);
        _Var1 = Check(&Rn,DVar7);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
      break;
    case 0x3d3:
    case 0x3d6:
    case 0x3d9:
    case 0x3dc:
    case 0x3df:
    case 0x3e2:
    case 1000:
    case 0x3ee:
    case 0x3f4:
    }
    return Rn;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeVLDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// First output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1q16: case ARM_VLD1q32: case ARM_VLD1q64: case ARM_VLD1q8:
		case ARM_VLD1q16wb_fixed: case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_fixed: case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_fixed: case ARM_VLD1q64wb_register:
		case ARM_VLD1q8wb_fixed: case ARM_VLD1q8wb_register:
		case ARM_VLD2d16: case ARM_VLD2d32: case ARM_VLD2d8:
		case ARM_VLD2d16wb_fixed: case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_fixed: case ARM_VLD2d32wb_register:
		case ARM_VLD2d8wb_fixed: case ARM_VLD2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2b16:
		case ARM_VLD2b32:
		case ARM_VLD2b8:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
		default:
			break;
	}

	// Third output register
	switch(MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Writeback operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d8Twb_register:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d16Twb_register:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d32Twb_register:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d64Twb_register:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d8Qwb_register:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d16Qwb_register:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d32Qwb_register:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d64Qwb_register:
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
		case ARM_VLD2d8wb_register:
		case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_register:
		case ARM_VLD2q8wb_register:
		case ARM_VLD2q16wb_register:
		case ARM_VLD2q32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b8wb_register:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_register:
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			// The below have been updated to have explicit am6offset split
			// between fixed and register offset. For those instructions not
			// yet updated, we need to add an additional reg0 operand for the
			// fixed variant.
			//
			// The fixed offset encodes as Rm == 0xd, so we check for that.
			if (Rm == 0xd) {
				MCOperand_CreateReg0(Inst, 0);
				break;
			}
			// Fall through to handle the register offset variant.
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
			// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
			// variant encodes Rm == 0xf. Anything else is a register offset post-
			// increment and we need to add the register operand to the instruction.
			if (Rm != 0xD && Rm != 0xF &&
					!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
			break;
	}

	return S;
}